

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_energy_matrix.cpp
# Opt level: O1

void __thiscall
s_energy_matrix::compute_hotspot_energy
          (s_energy_matrix *this,cand_pos_t i,cand_pos_t j,bool is_stack)

{
  energy_t eVar1;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,is_stack) == 0) {
    eVar1 = HairpinE(this,&this->seq_,this->S_,this->S1_,this->params_,i,j);
  }
  else {
    eVar1 = compute_stack(this,i,j,this->params_);
  }
  (this->nodes).super__Vector_base<free_energy_node,_std::allocator<free_energy_node>_>._M_impl.
  super__Vector_impl_data._M_start
  [(j - i) + (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[i]].energy = eVar1;
  return;
}

Assistant:

void s_energy_matrix::compute_hotspot_energy (cand_pos_t i, cand_pos_t j, bool is_stack)
{
    //printf("in compute_hotspot_energy i:%d j:%d\n",i,j);
    energy_t energy = 0;
    if(is_stack){
        energy = compute_stack(i,j,params_);
        // printf("stack: %d\n",energy);
    }else{
        energy = HairpinE(seq_,S_,S1_,params_,i,j);
        // printf("hairpin: %d\n",energy);
    }
        
    cand_pos_t ij = index[i]+j-i;
    nodes[ij].energy = energy;
    return;
}